

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O2

void anon_unknown.dwarf_a9832::testRSMatrix(M44f *M,V3f *t,V3f *r,V3f *s)

{
  Matrix44<float> local_60;
  
  local_60.x[0][0] = 1.0;
  local_60.x[0][1] = 0.0;
  local_60.x[0][2] = 0.0;
  local_60.x[0][3] = 0.0;
  local_60.x[1][0] = 0.0;
  local_60.x[1][1] = 1.0;
  local_60.x[1][2] = 0.0;
  local_60.x[1][3] = 0.0;
  local_60.x[2][0] = 0.0;
  local_60.x[2][1] = 0.0;
  local_60.x[2][2] = 1.0;
  local_60.x[2][3] = 0.0;
  local_60.x[3][0] = 0.0;
  local_60.x[3][1] = 0.0;
  local_60.x[3][2] = 0.0;
  local_60.x[3][3] = 1.0;
  Imath_3_2::Matrix44<float>::translate<float>(&local_60,t);
  Imath_3_2::Matrix44<float>::rotate<float>(&local_60,r);
  Imath_3_2::Matrix44<float>::scale<float>(&local_60,s);
  compareMat(M,&local_60);
  return;
}

Assistant:

void
testRSMatrix (M44f& M, V3f& t, V3f& r, V3f& s)
{
    M44f N;
    N.makeIdentity ();
    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.scale (s);

    compareMat (M, N);
}